

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mockingboard.hpp
# Opt level: O2

void __thiscall Apple::II::Mockingboard::Mockingboard(Mockingboard *this,AYPair *ays)

{
  (this->super_Card).select_constraints_ = 3;
  (this->super_Card).delegate_ = (Delegate *)0x0;
  (this->super_Card)._vptr_Card = (_func_int **)&PTR__Card_0057e5e8;
  MOS::MOS6522::MOS6522<Apple::II::Mockingboard::AYVIA>::MOS6522(this->vias_,this->handlers_);
  MOS::MOS6522::MOS6522<Apple::II::Mockingboard::AYVIA>::MOS6522
            (this->vias_ + 1,this->handlers_ + 1);
  this->handlers_[0].card = this;
  this->handlers_[0].ay = (AY38910SampleSource<false> *)ays;
  this->handlers_[1].card = this;
  this->handlers_[1].ay = (AY38910SampleSource<false> *)&ays->field_0x1150;
  Card::set_select_constraints(&this->super_Card,0);
  return;
}

Assistant:

Mockingboard(AYPair &ays) :
			vias_{ {handlers_[0]}, {handlers_[1]} },
			handlers_{ {*this, ays.get(0)}, {*this, ays.get(1)}} {
			set_select_constraints(0);
		}